

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_connect(connectdata *conn,_Bool *done)

{
  _Bool _Var1;
  CURLcode CVar2;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  Curl_conncontrol(conn,0);
  conn_local._4_4_ = Curl_proxy_connect(conn,0);
  if (conn_local._4_4_ == CURLE_OK) {
    if (((conn->bits).proxy_connect_closed & 1U) == 0) {
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (((conn->bits).proxy_ssl_connected[0] & 1U) == 0)) {
        conn_local._4_4_ = CURLE_OK;
      }
      else {
        _Var1 = Curl_connect_ongoing(conn);
        if (_Var1) {
          conn_local._4_4_ = CURLE_OK;
        }
        else if ((((conn->data->set).haproxyprotocol & 1U) == 0) ||
                (conn_local._4_4_ = add_haproxy_protocol_header(conn), conn_local._4_4_ == CURLE_OK)
                ) {
          if ((conn->given->protocol & 2) == 0) {
            *done = true;
          }
          else {
            CVar2 = https_connecting(conn,done);
            if (CVar2 != CURLE_OK) {
              return CVar2;
            }
          }
          conn_local._4_4_ = CURLE_OK;
        }
      }
    }
    else {
      conn_local._4_4_ = CURLE_OK;
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_http_connect(struct connectdata *conn, bool *done)
{
  CURLcode result;

  /* We default to persistent connections. We set this already in this connect
     function to make the re-use checks properly be able to check this bit. */
  connkeep(conn, "HTTP default");

  /* the CONNECT procedure might not have been completed */
  result = Curl_proxy_connect(conn, FIRSTSOCKET);
  if(result)
    return result;

  if(conn->bits.proxy_connect_closed)
    /* this is not an error, just part of the connection negotiation */
    return CURLE_OK;

  if(CONNECT_FIRSTSOCKET_PROXY_SSL())
    return CURLE_OK; /* wait for HTTPS proxy SSL initialization to complete */

  if(Curl_connect_ongoing(conn))
    /* nothing else to do except wait right now - we're not done here. */
    return CURLE_OK;

  if(conn->data->set.haproxyprotocol) {
    /* add HAProxy PROXY protocol header */
    result = add_haproxy_protocol_header(conn);
    if(result)
      return result;
  }

  if(conn->given->protocol & CURLPROTO_HTTPS) {
    /* perform SSL initialization */
    result = https_connecting(conn, done);
    if(result)
      return result;
  }
  else
    *done = TRUE;

  return CURLE_OK;
}